

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.h
# Opt level: O0

void __thiscall ValueEvent::ValueEvent(ValueEvent *this,double n_value)

{
  Clock *this_00;
  Event *in_RDI;
  _func_int **in_XMM0_Qa;
  double dVar1;
  
  Event::Event(in_RDI);
  in_RDI->_vptr_Event = (_func_int **)&PTR_setWeight_00132c20;
  in_RDI[1]._vptr_Event = (_func_int **)0x0;
  in_RDI->type = Value;
  this_00 = Clock::getInstance();
  dVar1 = Clock::getCurrentTime(this_00);
  in_RDI->eventTime = dVar1;
  in_RDI[1]._vptr_Event = in_XMM0_Qa;
  return;
}

Assistant:

ValueEvent(double n_value) {
        type = EventType::Value;
        eventTime = Clock::getInstance()->getCurrentTime();
        value = n_value;
    }